

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skins.cpp
# Opt level: O2

void __thiscall CSkins::SaveSkinfile(CSkins *this,char *pSaveSkinName)

{
  uint uVar1;
  long lVar2;
  IStorage *pIVar3;
  int iVar4;
  undefined4 extraout_var;
  byte bVar5;
  long lVar6;
  int PartIndex;
  long lVar7;
  long in_FS_OFFSET;
  CJsonWriter Writer;
  char aBuf [512];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  str_format(aBuf,0x200,"skins/%s.json",pSaveSkinName);
  pIVar3 = ((this->super_CComponent).m_pClient)->m_pStorage;
  iVar4 = (*(pIVar3->super_IInterface)._vptr_IInterface[4])(pIVar3,aBuf,2,0,0,0,0,0);
  if ((IOHANDLE)CONCAT44(extraout_var,iVar4) != (IOHANDLE)0x0) {
    CJsonWriter::CJsonWriter(&Writer,(IOHANDLE)CONCAT44(extraout_var,iVar4));
    CJsonWriter::BeginObject(&Writer);
    CJsonWriter::WriteAttribute(&Writer,"skin");
    CJsonWriter::BeginObject(&Writer);
    for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
      if (*ms_apSkinVariables[lVar7] != '\0') {
        CJsonWriter::WriteAttribute(&Writer,ms_apSkinPartNames[lVar7]);
        CJsonWriter::BeginObject(&Writer);
        CJsonWriter::WriteAttribute(&Writer,"filename");
        CJsonWriter::WriteStrValue(&Writer,ms_apSkinVariables[lVar7]);
        iVar4 = *ms_apUCCVariables[lVar7];
        CJsonWriter::WriteAttribute(&Writer,"custom_colors");
        CJsonWriter::WriteBoolValue(&Writer,iVar4 != 0);
        if (iVar4 != 0) {
          bVar5 = 0x10;
          for (lVar6 = 0; lVar6 != 0x18; lVar6 = lVar6 + 8) {
            iVar4 = *ms_apColorVariables[lVar7];
            CJsonWriter::WriteAttribute(&Writer,*(char **)((long)ms_apColorComponents + lVar6));
            CJsonWriter::WriteIntValue(&Writer,iVar4 >> (bVar5 & 0x1f) & 0xff);
            bVar5 = bVar5 - 8;
          }
          if (lVar7 == 1) {
            uVar1 = *ms_apColorVariables[1];
            CJsonWriter::WriteAttribute(&Writer,"alp");
            CJsonWriter::WriteIntValue(&Writer,uVar1 >> 0x18);
          }
        }
        CJsonWriter::EndObject(&Writer);
      }
    }
    CJsonWriter::EndObject(&Writer);
    CJsonWriter::EndObject(&Writer);
    AddSkin(this,pSaveSkinName);
    CJsonWriter::~CJsonWriter(&Writer);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CSkins::SaveSkinfile(const char *pSaveSkinName)
{
	char aBuf[IO_MAX_PATH_LENGTH];
	str_format(aBuf, sizeof(aBuf), "skins/%s.json", pSaveSkinName);
	IOHANDLE File = Storage()->OpenFile(aBuf, IOFLAG_WRITE, IStorage::TYPE_SAVE);
	if(!File)
		return;

	CJsonWriter Writer(File);

	Writer.BeginObject();
	Writer.WriteAttribute("skin");
	Writer.BeginObject();
	for(int PartIndex = 0; PartIndex < NUM_SKINPARTS; PartIndex++)
	{
		if(!ms_apSkinVariables[PartIndex][0])
			continue;

		// part start
		Writer.WriteAttribute(ms_apSkinPartNames[PartIndex]);
		Writer.BeginObject();
		{
			Writer.WriteAttribute("filename");
			Writer.WriteStrValue(ms_apSkinVariables[PartIndex]);

			const bool CustomColors = *ms_apUCCVariables[PartIndex];
			Writer.WriteAttribute("custom_colors");
			Writer.WriteBoolValue(CustomColors);

			if(CustomColors)
			{
				for(int c = 0; c < NUM_COLOR_COMPONENTS-1; c++)
				{
					int Val = (*ms_apColorVariables[PartIndex] >> (2-c)*8) & 0xff;
					Writer.WriteAttribute(ms_apColorComponents[c]);
					Writer.WriteIntValue(Val);
				}
				if(PartIndex == SKINPART_MARKING)
				{
					int Val = (*ms_apColorVariables[PartIndex] >> 24) & 0xff;
					Writer.WriteAttribute(ms_apColorComponents[3]);
					Writer.WriteIntValue(Val);
				}
			}
		}
		Writer.EndObject();
	}
	Writer.EndObject();
	Writer.EndObject();

	// add new skin to the skin list
	AddSkin(pSaveSkinName);
}